

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O1

void * __thiscall MemoryFootprintAllocator::fastMalloc(MemoryFootprintAllocator *this,size_t size)

{
  void *pvVar1;
  int iVar2;
  mapped_type *pmVar3;
  void *ptr_1;
  void *ptr;
  void *local_28;
  void *local_20;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  local_28 = (void *)0x0;
  iVar2 = posix_memalign(&local_28,0x40,size + 0x40);
  if (iVar2 != 0) {
    local_28 = (void *)0x0;
  }
  local_20 = local_28;
  pmVar3 = std::
           map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
           ::operator[](&this->bookkeeper,&local_20);
  pvVar1 = local_20;
  *pmVar3 = size;
  iVar2 = (int)size + this->current_memory_usage;
  this->current_memory_usage = iVar2;
  if (iVar2 < this->memory_footprint) {
    iVar2 = this->memory_footprint;
  }
  this->memory_footprint = iVar2;
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return pvVar1;
}

Assistant:

virtual void* fastMalloc(size_t size)
    {
        ncnn::MutexLockGuard g(lock);
        void* ptr = ncnn::fastMalloc(size);
        bookkeeper[ptr] = size;
        current_memory_usage += size;
        memory_footprint = std::max(memory_footprint, current_memory_usage);
        return ptr;
    }